

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O0

int run_test_we_get_signal_one_shot(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  timer_ctx tc;
  signal_ctx sc;
  
  puVar2 = uv_default_loop();
  start_timer(puVar2,0x11,(timer_ctx *)&loop);
  start_watcher(puVar2,0x11,(signal_ctx *)&tc.signum,1);
  tc.signum = 2;
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal.c"
            ,0xde,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if ((int)loop != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal.c"
            ,0xdf,"tc.ncalls == NSIGNALS");
    abort();
  }
  if (tc._164_4_ != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal.c"
            ,0xe0,"sc.ncalls == 1");
    abort();
  }
  start_timer(puVar2,0x11,(timer_ctx *)&loop);
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal.c"
            ,0xe3,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (tc._164_4_ != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal.c"
            ,0xe4,"sc.ncalls == 1");
    abort();
  }
  tc._164_4_ = 0;
  tc.signum = 0;
  uv_signal_start_oneshot((uv_signal_t *)&sc,signal_cb_one_shot,0x11);
  start_timer(puVar2,0x11,(timer_ctx *)&loop);
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal.c"
            ,0xea,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if ((int)loop != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal.c"
            ,0xeb,"tc.ncalls == NSIGNALS");
    abort();
  }
  if (tc._164_4_ != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal.c"
            ,0xec,"sc.ncalls == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal.c"
            ,0xee,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(we_get_signal_one_shot) {
  struct signal_ctx sc;
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, &sc, 1);
  sc.stop_or_close = NOOP;
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(tc.ncalls == NSIGNALS);
  ASSERT(sc.ncalls == 1);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(sc.ncalls == 1);

  sc.ncalls = 0;
  sc.stop_or_close = CLOSE; /* now close it when it's done */
  uv_signal_start_oneshot(&sc.handle, signal_cb_one_shot, SIGCHLD);
  start_timer(loop, SIGCHLD, &tc);
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(tc.ncalls == NSIGNALS);
  ASSERT(sc.ncalls == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}